

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O2

void readCore(string *fn,uint64_t *headerTimeAccum,uint64_t *imgDataTimeAccum,
             uint64_t *closeTimeAccum,uint64_t *pixCount)

{
  int iVar1;
  long lVar2;
  long lVar3;
  Task *pTVar4;
  CoreReadTask *this;
  long lVar5;
  runtime_error *this_00;
  ostream *poVar6;
  logic_error *this_01;
  code *pcVar7;
  undefined *puVar8;
  long lVar9;
  pointer ptr;
  int32_t linesread;
  int32_t ccount;
  TaskGroup local_120 [8];
  uint64_t sizePerChunk;
  exr_lineorder_t lo;
  exr_storage_t stortype;
  long local_108;
  exr_context_t c;
  exr_attr_box2i_t dw;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rawBuf;
  undefined8 local_98;
  code *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_48 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_38 = 0;
  local_98 = 0x68;
  uStack_40 = 0xbf800000fffffffe;
  local_90 = error_handler_new;
  lVar2 = std::chrono::_V2::steady_clock::now();
  iVar1 = exr_start_read(&c,(fn->_M_dataplus)._M_p,&local_98);
  if (iVar1 != 0) {
    return;
  }
  lVar3 = std::chrono::_V2::steady_clock::now();
  iVar1 = exr_get_data_window(c,0,&dw);
  if (iVar1 == 0) {
    local_108 = (long)dw.max.x - (long)dw.min.x;
    if (local_108 < 0) {
      lVar9 = 0;
LAB_00104500:
      *pixCount = *pixCount + lVar9;
      lVar9 = std::chrono::_V2::steady_clock::now();
      exr_finish(&c);
      lVar5 = std::chrono::_V2::steady_clock::now();
      *headerTimeAccum = *headerTimeAccum + (lVar3 - lVar2);
      *imgDataTimeAccum = *imgDataTimeAccum + (lVar9 - lVar3);
      *closeTimeAccum = *closeTimeAccum + (lVar5 - lVar9);
      return;
    }
    iVar1 = exr_get_storage(c,0,&stortype);
    if (iVar1 == 0) {
      if ((stortype & ~EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_TILED) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error((logic_error *)this_00,"Tiled performance read test NYI");
      }
      else {
        iVar1 = exr_get_lineorder(c,0,&lo);
        if (iVar1 == 0) {
          if (lo != EXR_LINEORDER_DECREASING_Y) {
            rawBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            sizePerChunk = 0;
            ccount = 0;
            rawBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            rawBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            linesread = 0;
            iVar1 = exr_get_chunk_unpacked_size(c,0);
            if (iVar1 == 0) {
              iVar1 = exr_get_chunk_count(c,0,&ccount);
              if (iVar1 == 0) {
                iVar1 = exr_get_scanlines_per_chunk(c,0,&linesread);
                if (iVar1 == 0) {
                  if ((0 < (long)ccount) && (1 < sizePerChunk + 1)) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&rawBuf,sizePerChunk * (long)ccount);
                    ptr = rawBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                    IlmThread_3_4::TaskGroup::TaskGroup(local_120);
                    pTVar4 = (Task *)IlmThread_3_4::ThreadPool::globalThreadPool();
                    local_108 = local_108 + 1;
                    lVar9 = 0;
                    for (; dw.min.y <= dw.max.y; dw.min.y = dw.min.y + linesread) {
                      this = (CoreReadTask *)operator_new(0x28);
                      CoreReadTask::CoreReadTask(this,local_120,c,dw.min.y,ptr);
                      IlmThread_3_4::ThreadPool::addTask(pTVar4);
                      ptr = ptr + sizePerChunk;
                      lVar9 = lVar9 + linesread * local_108;
                    }
                    IlmThread_3_4::TaskGroup::~TaskGroup(local_120);
                    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                              (&rawBuf.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
                    goto LAB_00104500;
                  }
                  exr_print_context_info(c,1);
                  poVar6 = std::operator<<((ostream *)&std::cerr,"sizePerChunk: ");
                  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                  std::endl<char,std::char_traits<char>>(poVar6);
                  poVar6 = std::operator<<((ostream *)&std::cerr,"chunk_count: ");
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,ccount);
                  std::endl<char,std::char_traits<char>>(poVar6);
                  poVar6 = std::operator<<((ostream *)&std::cerr,"linesperchunk: ");
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,linesread);
                  std::endl<char,std::char_traits<char>>(poVar6);
                  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(this_01,"invalid chunk information");
                }
                else {
                  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error
                            (this_01,"Unable to get scanlines per chunk for part 0");
                }
              }
              else {
                this_01 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(this_01,"Unable to get chunk count for part 0");
              }
            }
            else {
              this_01 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(this_01,"Unable to get chunk unpacked size for part 0");
            }
            __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"decreasing y not yet finished");
          pcVar7 = std::runtime_error::~runtime_error;
          puVar8 = &std::runtime_error::typeinfo;
          goto LAB_001045e1;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error((logic_error *)this_00,"Unable to query line order from part")
        ;
      }
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error((logic_error *)this_00,"Unable to query storage type from part")
      ;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error((logic_error *)this_00,"Unable to query data window from part");
  }
  pcVar7 = std::logic_error::~logic_error;
  puVar8 = &std::logic_error::typeinfo;
LAB_001045e1:
  __cxa_throw(this_00,puVar8,pcVar7);
}

Assistant:

static void
readCore (
    const std::string& fn,
    uint64_t&          headerTimeAccum,
    uint64_t&          imgDataTimeAccum,
    uint64_t&          closeTimeAccum,
    uint64_t&          pixCount)
{
    try
    {
        exr_context_t             c;
        exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;

        cinit.error_handler_fn = &error_handler_new;

        auto hstart = std::chrono::steady_clock::now ();
        if (EXR_ERR_SUCCESS == exr_start_read (&c, fn.c_str (), &cinit))
        {
            auto hend = std::chrono::steady_clock::now ();
            pixCount += read_pixels_raw (c);
            auto imgtime = std::chrono::steady_clock::now ();
            exr_finish (&c);
            auto closetime = std::chrono::steady_clock::now ();
            headerTimeAccum +=
                std::chrono::duration_cast<std::chrono::nanoseconds> (
                    hend - hstart)
                    .count ();
            imgDataTimeAccum +=
                std::chrono::duration_cast<std::chrono::nanoseconds> (
                    imgtime - hend)
                    .count ();
            closeTimeAccum +=
                std::chrono::duration_cast<std::chrono::nanoseconds> (
                    closetime - imgtime)
                    .count ();
        }
    }
    catch (std::exception& e)
    {
        std::cerr << "readCore: " << e.what () << std::endl;
        throw;
    }
}